

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O2

void __thiscall xs::PosixTestProcess::cleanup(PosixTestProcess *this,EVP_PKEY_CTX *ctx)

{
  Process *this_00;
  bool bVar1;
  int __sig;
  __pid_t __pid;
  
  __pid = (__pid_t)ctx;
  posix::CaseListWriter::stop(&this->m_caseListWriter);
  posix::FileReader::stop(&this->m_logReader);
  de::BlockBuffer<unsigned_char>::cancel(&this->m_infoBuffer);
  posix::PipeReader::stop(&this->m_stdErrReader);
  posix::PipeReader::stop(&this->m_stdOutReader);
  de::BlockBuffer<unsigned_char>::clear(&this->m_infoBuffer);
  if (this->m_process != (Process *)0x0) {
    bVar1 = de::Process::isRunning(this->m_process);
    if (bVar1) {
      de::Process::kill(this->m_process,__pid,__sig);
      de::Process::waitForFinish(this->m_process);
    }
    this_00 = this->m_process;
    if (this_00 != (Process *)0x0) {
      de::Process::~Process(this_00);
    }
    operator_delete(this_00,8);
    this->m_process = (Process *)0x0;
  }
  return;
}

Assistant:

void PosixTestProcess::cleanup (void)
{
	m_caseListWriter.stop();
	m_logReader.stop();

	// \note Info buffer must be canceled before stopping pipe readers.
	m_infoBuffer.cancel();

	m_stdErrReader.stop();
	m_stdOutReader.stop();

	// Reset info buffer.
	m_infoBuffer.clear();

	if (m_process)
	{
		try
		{
			if (m_process->isRunning())
			{
				m_process->kill();
				m_process->waitForFinish();
			}
		}
		catch (const de::ProcessError& e)
		{
			printf("PosixTestProcess::stop(): Failed to kill process: %s\n", e.what());
		}

		delete m_process;
		m_process = DE_NULL;
	}
}